

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O1

int Ssw_ManSweepBmcConstr(Ssw_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  Aig_Man_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  Aig_Obj_t *pAVar13;
  timespec ts;
  ulong local_50;
  timespec local_48;
  long local_38;
  
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pAVar3 = Aig_ManStart(p->pPars->nFramesK * p->pAig->vObjs->nSize);
  p->pFrames = pAVar3;
  pAVar3 = p->pAig;
  if (0 < pAVar3->nRegs) {
    iVar2 = 0;
    do {
      uVar8 = pAVar3->nTruePis + iVar2;
      if (((int)uVar8 < 0) || (pAVar3->vCis->nSize <= (int)uVar8)) {
LAB_006a109e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p->pNodeToFrames[(long)*(int *)((long)pAVar3->vCis->pArray[uVar8] + 0x24) * (long)p->nFrames]
           = (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1);
      iVar2 = iVar2 + 1;
      pAVar3 = p->pAig;
    } while (iVar2 < pAVar3->nRegs);
  }
  p->fRefined = 0;
  local_38 = lVar9;
  if (p->pPars->nFramesK < 1) {
    local_50._0_4_ = 0;
  }
  else {
    local_50 = 0;
    iVar2 = 0;
    do {
      p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + iVar2] = p->pFrames->pConst1;
      pAVar3 = p->pAig;
      if (0 < pAVar3->nTruePis) {
        lVar9 = 0;
        do {
          if (pAVar3->vCis->nSize <= lVar9) goto LAB_006a109e;
          pvVar1 = pAVar3->vCis->pArray[lVar9];
          pAVar4 = Aig_ObjCreateCi(p->pFrames);
          if (((int)local_50 < 0) || (p->vInits->nSize <= (int)local_50 + (int)lVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          *(ulong *)&pAVar4->field_0x18 =
               (*(ulong *)&pAVar4->field_0x18 & 0xfffffffffffffff7) +
               (ulong)(p->vInits->pArray[local_50 + lVar9] & 1) * 8;
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar2] = pAVar4;
          lVar9 = lVar9 + 1;
          pAVar3 = p->pAig;
        } while (lVar9 < pAVar3->nTruePis);
        local_50 = (ulong)(uint)((int)local_50 + (int)lVar9);
      }
      pAVar3 = p->pAig;
      uVar7 = (ulong)(uint)pAVar3->nTruePos;
      if (0 < pAVar3->nTruePos) {
        lVar9 = 0;
        do {
          if (pAVar3->vCos->nSize <= lVar9) goto LAB_006a109e;
          if ((long)(int)uVar7 - (long)pAVar3->nConstrs <= lVar9) {
            pvVar1 = pAVar3->vCos->pArray[lVar9];
            pAVar5 = Ssw_ManSweepBmcConstr_rec
                               (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),
                                iVar2);
            pAVar13 = (Aig_Obj_t *)
                      ((ulong)((uint)*(undefined8 *)((long)pvVar1 + 8) & 1) ^ (ulong)pAVar5);
            pAVar4 = p->pFrames->pConst1;
            if (pAVar4 == (Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe)) {
              if (((ulong)pAVar13 & 1) == 0) {
                __assert_fail("Aig_IsComplement(pObjNew)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                              ,0x214,"int Ssw_ManSweepBmcConstr(Ssw_Man_t *)");
              }
            }
            else {
              Ssw_NodesAreConstrained(p,pAVar13,(Aig_Obj_t *)((ulong)pAVar4 ^ 1));
            }
          }
          lVar9 = lVar9 + 1;
          pAVar3 = p->pAig;
          uVar7 = (ulong)pAVar3->nTruePos;
        } while (lVar9 < (long)uVar7);
      }
      pAVar3 = p->pAig;
      if (0 < pAVar3->nRegs) {
        iVar11 = 0;
        do {
          uVar8 = pAVar3->nTruePis + iVar11;
          if (((int)uVar8 < 0) || (pAVar3->vCis->nSize <= (int)uVar8)) goto LAB_006a109e;
          uVar8 = Ssw_ManSweepNodeConstr(p,(Aig_Obj_t *)pAVar3->vCis->pArray[uVar8],iVar2,uVar8);
          p->fRefined = p->fRefined | uVar8;
          iVar11 = iVar11 + 1;
          pAVar3 = p->pAig;
        } while (iVar11 < pAVar3->nRegs);
      }
      pVVar6 = p->pAig->vObjs;
      if (0 < pVVar6->nSize) {
        lVar9 = 0;
        do {
          pAVar4 = (Aig_Obj_t *)pVVar6->pArray[lVar9];
          if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7))
          {
            if (((ulong)pAVar4 & 1) != 0) goto LAB_006a10dc;
            uVar7 = (ulong)pAVar4->pFanin0 & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              pAVar5 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar5 = (Aig_Obj_t *)
                       ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                       (ulong)p->pNodeToFrames[*(int *)(uVar7 + 0x24) * p->nFrames + iVar2]);
            }
            uVar7 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              pAVar13 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar13 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar4->pFanin1 & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar7 + 0x24) * p->nFrames + iVar2]);
            }
            pAVar5 = Aig_And(p->pFrames,pAVar5,pAVar13);
            iVar11 = pAVar4->Id * p->nFrames + iVar2;
            p->pNodeToFrames[iVar11] = pAVar5;
            uVar8 = Ssw_ManSweepNodeConstr(p,pAVar4,iVar2,iVar11);
            p->fRefined = p->fRefined | uVar8;
          }
          lVar9 = lVar9 + 1;
          pVVar6 = p->pAig->vObjs;
        } while (lVar9 < pVVar6->nSize);
      }
      if (iVar2 == p->pPars->nFramesK + -1) break;
      pVVar6 = p->pAig->vCos;
      if (0 < pVVar6->nSize) {
        lVar9 = 0;
        do {
          pvVar1 = pVVar6->pArray[lVar9];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_006a10dc:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                     (ulong)p->pNodeToFrames[*(int *)(uVar7 + 0x24) * p->nFrames + iVar2]);
          }
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar2] = pAVar4;
          lVar9 = lVar9 + 1;
          pVVar6 = p->pAig->vCos;
        } while (lVar9 < pVVar6->nSize);
      }
      pAVar3 = p->pAig;
      if (0 < pAVar3->nRegs) {
        iVar11 = 0;
        do {
          uVar8 = pAVar3->nTruePos + iVar11;
          if (((((int)uVar8 < 0) || (pAVar3->vCos->nSize <= (int)uVar8)) ||
              (uVar12 = pAVar3->nTruePis + iVar11, (int)uVar12 < 0)) ||
             (pAVar3->vCis->nSize <= (int)uVar12)) goto LAB_006a109e;
          pAVar4 = p->pNodeToFrames
                   [*(int *)((long)pAVar3->vCos->pArray[uVar8] + 0x24) * p->nFrames + iVar2];
          p->pNodeToFrames
          [p->nFrames * *(int *)((long)pAVar3->vCis->pArray[uVar12] + 0x24) + iVar2 + 1] = pAVar4;
          Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe));
          iVar11 = iVar11 + 1;
          pAVar3 = p->pAig;
        } while (iVar11 < pAVar3->nRegs);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < p->pPars->nFramesK);
  }
  lVar9 = local_38;
  if (p->vInits->nSize != (int)local_50 + p->pAig->nTruePis) {
    __assert_fail("Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                  ,0x231,"int Ssw_ManSweepBmcConstr(Ssw_Man_t *)");
  }
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeBmc = p->timeBmc + lVar10 + lVar9;
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepBmcConstr( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f, iLits;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // build the constraint outputs
    iLits = 0;
    p->fRefined = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            pObjNew->fPhase = Vec_IntEntry( p->vInits, iLits++ );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // build the constraint cones
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
            pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
            if ( Aig_Regular(pObjNew) == Aig_ManConst1(p->pFrames) )
            {
                assert( Aig_IsComplement(pObjNew) );
                continue;
            }
            Ssw_NodesAreConstrained( p, pObjNew, Aig_ManConst0(p->pFrames) );
        }        
        // sweep flops
        Saig_ManForEachLo( p->pAig, pObj, i )
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 1 );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 1 );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    assert( Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}